

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cc
# Opt level: O2

size_t OPENSSL_strlcat(char *dst,char *src,size_t dst_size)

{
  size_t dst_size_00;
  size_t sVar1;
  char *dst_00;
  
  dst_00 = dst + dst_size;
  sVar1 = 0;
  do {
    dst_size_00 = dst_size - sVar1;
    if (dst_size_00 == 0) {
LAB_00187a63:
      sVar1 = OPENSSL_strlcpy(dst_00,src,dst_size_00);
      return sVar1 + dst_size;
    }
    if (dst[sVar1] == '\0') {
      dst_00 = dst + sVar1;
      dst_size = sVar1;
      goto LAB_00187a63;
    }
    sVar1 = sVar1 + 1;
  } while( true );
}

Assistant:

size_t OPENSSL_strlcat(char *dst, const char *src, size_t dst_size) {
  size_t l = 0;
  for (; dst_size > 0 && *dst; dst_size--, dst++) {
    l++;
  }
  return l + OPENSSL_strlcpy(dst, src, dst_size);
}